

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPartialLine.hpp
# Opt level: O2

void njoy::ENDFtk::record::Zipper::
     readPartialLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>,std::tuple<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,0ul,1ul>
               (long nEntries,long *iteratorTuple,
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char *in_stack_ffffffffffffffa8;
  tuple<long,_long> leftovers;
  
  lVar2 = 0;
  lVar3 = nEntries;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    tools::disco::
    Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::RetainCarriage>
    ::read<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,long,long>
              (it,end,(long *)(iteratorTuple[1] + lVar2),(long *)(*iteratorTuple + lVar2));
    lVar2 = lVar2 + 8;
  }
  leftovers.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl = (_Head_base<1UL,_long,_false>)0;
  leftovers.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>._M_head_impl = 0;
  nEntries = nEntries + -4;
  do {
    nEntries = nEntries + 1;
    if (nEntries == 0) {
      verifyTail<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (it,end,lineNumber,MAT,MF,MT);
      return;
    }
    tools::disco::
    Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::RetainCarriage>
    ::read<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,long,long>
              (it,end,&leftovers.super__Tuple_impl<0UL,_long,_long>.
                       super__Head_base<0UL,_long,_false>._M_head_impl,(long *)&leftovers);
  } while (leftovers.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
           super__Head_base<1UL,_long,_false>._M_head_impl == 0 &&
           leftovers.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>.
           _M_head_impl == 0);
  tools::Log::error<char_const*>(in_stack_ffffffffffffffa8);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
readPartialLine
( uint64_t nEntries, Tuple& iteratorTuple, Iterator& it, const Iterator& end,
  long& lineNumber, int MAT, int MF, int MT,
  std::index_sequence< indices... > ){

  using namespace njoy::tools;

//auto increment = []( uint64_t offset, auto& iterator ){ iterator+= offset; };

  for ( uint64_t offset = 0; offset < nEntries; ++offset ){
    Zip::TupleFormat::read
      ( it, end, std::get< indices >( iteratorTuple )[offset]... );
  }

  auto remainingEntries = Zip::tuplesPerRecord - nEntries;
  std::tuple< typename Zip:: template Type< indices >... > leftovers;

  while ( remainingEntries-- ){
    Zip::TupleFormat::read( it, end, std::get< indices >( leftovers )... );
    if ( leftovers != Zip::defaultTuple() ){
      Log::error( "Encountered non-default value where none was expected" );
      throw std::exception();
    }
  }

  using Gap = disco::Record
              < disco::Column< Zip::nPad >, disco::RetainCarriage >;

  Gap::read( it, end );

  verifyTail( it, end, lineNumber, MAT, MF, MT );
}